

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O3

void __thiscall
ExprWriterTest_WriteBinaryExpr_Test::~ExprWriterTest_WriteBinaryExpr_Test
          (ExprWriterTest_WriteBinaryExpr_Test *this)

{
  LogicalConstant *this_00;
  
  this_00 = &this[-1].super_ExprWriterTest.l0;
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
            ((BasicExprFactory<std::allocator<char>_> *)this);
  testing::Test::~Test((Test *)this_00);
  operator_delete(this_00,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WriteBinaryExpr) {
  auto x1 = MakeVariable(0);
  auto n42 = MakeConst(42);
  CHECK_WRITE("x1 + 42", MakeBinary(ex::ADD, x1, n42));
  CHECK_WRITE("x1 - 42", MakeBinary(ex::SUB, x1, n42));
  CHECK_WRITE("x1 * 42", MakeBinary(ex::MUL, x1, n42));
  CHECK_WRITE("x1 / 42", MakeBinary(ex::DIV, x1, n42));
  CHECK_WRITE("x1 mod 42", MakeBinary(ex::MOD, x1, n42));
  CHECK_WRITE("x1 ^ 42", MakeBinary(ex::POW, x1, n42));
  CHECK_WRITE("x1 ^ 42", MakeBinary(ex::POW, x1, n42));
  CHECK_WRITE("x1 ^ 42", MakeBinary(ex::POW_CONST_BASE, x1, n42));
  CHECK_WRITE("x1 ^ 42", MakeBinary(ex::POW_CONST_EXP, x1, n42));
  CHECK_WRITE("x1 less 42", MakeBinary(ex::LESS, x1, n42));
  CHECK_WRITE("x1 div 42", MakeBinary(ex::TRUNC_DIV, x1, n42));
}